

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall
ProString::endsWith<char_const(&)[2],QString&>
          (ProString *this,QStringBuilder<const_char_(&)[2],_QString_&> *str)

{
  byte bVar1;
  ProString *in_RSI;
  QStringBuilder<const_char_(&)[2],_QString_&> *in_RDI;
  long in_FS_OFFSET;
  CaseSensitivity cs;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cs = (CaseSensitivity)((ulong)local_20 >> 0x20);
  ::QStringBuilder::operator_cast_to_QString(in_RDI);
  bVar1 = endsWith(in_RSI,(QString *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                   cs);
  QString::~QString((QString *)0x1e7dde);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const QStringBuilder<A, B> &str) { return endsWith(QString(str)); }